

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrpParser.cpp
# Opt level: O0

void __thiscall GrpParser::glyphAttrs(GrpParser *this)

{
  bool bVar1;
  int iVar2;
  undefined8 uVar3;
  ASTArray *nodes;
  ASTArray *this_00;
  AST *pAVar4;
  AST *this_01;
  long *in_RDI;
  ParserException *ex;
  RefAST tmp100_AST;
  RefAST tmp99_AST;
  RefAST tmp98_AST;
  RefAST X3_AST;
  RefAST X2_AST;
  RefAST X1_AST;
  RefAST A_AST;
  RefAST I_AST;
  RefToken I;
  RefAST glyphAttrs_AST;
  ASTPair currentAST;
  AST *in_stack_fffffffffffffd78;
  AST *in_stack_fffffffffffffd80;
  AST *in_stack_fffffffffffffd88;
  AST *in_stack_fffffffffffffd90;
  AST *in_stack_fffffffffffffd98;
  ASTArray *in_stack_fffffffffffffda0;
  RefToken *in_stack_fffffffffffffdb0;
  ASTFactory *in_stack_fffffffffffffdb8;
  Parser *in_stack_fffffffffffffdc0;
  ASTArray *in_stack_fffffffffffffdd0;
  ASTFactory *in_stack_fffffffffffffdd8;
  RefToken *in_stack_fffffffffffffdf8;
  NoViableAltException *in_stack_fffffffffffffe00;
  GrpParser *this_02;
  RefCount local_158 [55];
  undefined1 local_121;
  undefined1 local_120 [16];
  GrpParser *in_stack_fffffffffffffef0;
  undefined1 local_f0 [8];
  undefined1 local_e8 [48];
  undefined1 local_b8 [31];
  undefined1 local_99;
  undefined1 local_98 [8];
  undefined1 local_90 [40];
  undefined1 local_68 [72];
  RefCount<AST> local_20 [2];
  GrpParser *in_stack_fffffffffffffff0;
  
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
  ASTPair::ASTPair((ASTPair *)in_stack_fffffffffffffd90);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffd90,
             (RefCount<Token> *)in_stack_fffffffffffffd88);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  (**(code **)(*in_RDI + 0x28))(local_68,in_RDI,1);
  RefCount<Token>::operator=
            ((RefCount<Token> *)in_stack_fffffffffffffda0,
             (RefCount<Token> *)in_stack_fffffffffffffd98);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd90);
  this_02 = (GrpParser *)(in_RDI + 6);
  RefCount<Token>::RefCount
            ((RefCount<Token> *)in_stack_fffffffffffffd90,
             (RefCount<Token> *)in_stack_fffffffffffffd88);
  ASTFactory::create(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd90);
  Parser::match(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
  iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
  if (iVar2 == 0xb) {
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
    (**(code **)(*in_RDI + 0x28))(local_90,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd90);
    Parser::match(in_stack_fffffffffffffdc0,(int)((ulong)in_stack_fffffffffffffdb8 >> 0x20));
    iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    if (iVar2 != 0xc) {
      if ((((iVar2 != 0xd) && (iVar2 != 0x11)) && (iVar2 != 0x17)) && (2 < iVar2 - 0x3dU)) {
        local_99 = 1;
        uVar3 = __cxa_allocate_exception(0x40);
        (**(code **)(*in_RDI + 0x28))(local_98,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        local_99 = 0;
        __cxa_throw(uVar3,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      attrItemList(this_02);
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    }
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
    (**(code **)(*in_RDI + 0x28))(local_b8,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    iVar2 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd90);
    Parser::match(in_stack_fffffffffffffdc0,iVar2);
    operator_new(0x20);
    ASTArray::ASTArray(in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    ASTFactory::create(in_stack_fffffffffffffdd8,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
    ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
    ASTFactory::make(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  }
  else {
    if (iVar2 != 0x12) {
      local_121 = 1;
      uVar3 = __cxa_allocate_exception(0x40);
      (**(code **)(*in_RDI + 0x28))(local_120,in_RDI,1);
      NoViableAltException::NoViableAltException
                (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      local_121 = 0;
      __cxa_throw(uVar3,&NoViableAltException::typeinfo,NoViableAltException::~NoViableAltException)
      ;
    }
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
    (**(code **)(*in_RDI + 0x28))(local_e8,in_RDI,1);
    ASTFactory::create(in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
    iVar2 = (int)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd90);
    Parser::match(in_stack_fffffffffffffdc0,iVar2);
    (**(code **)(*in_RDI + 0x20))(in_RDI,1);
    bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd88,
                           (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
    if (bVar1) {
      (**(code **)(*in_RDI + 0x20))(in_RDI,2);
      bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd88,
                             (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      if (!bVar1) goto LAB_0020a739;
      attrItemFlat(in_stack_fffffffffffffff0);
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    }
    else {
LAB_0020a739:
      (**(code **)(*in_RDI + 0x20))(in_RDI,1);
      bVar1 = BitSet::member((BitSet *)in_stack_fffffffffffffd88,
                             (int)((ulong)in_stack_fffffffffffffd80 >> 0x20));
      if ((!bVar1) || (iVar2 = (**(code **)(*in_RDI + 0x20))(in_RDI,2), iVar2 != 0xb)) {
        uVar3 = __cxa_allocate_exception(0x40);
        (**(code **)(*in_RDI + 0x28))(local_f0,in_RDI,1);
        NoViableAltException::NoViableAltException
                  (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
        __cxa_throw(uVar3,&NoViableAltException::typeinfo,
                    NoViableAltException::~NoViableAltException);
      }
      attrItemStruct(in_stack_fffffffffffffef0);
      RefCount<AST>::operator=
                ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    }
    operator_new(0x20);
    ASTArray::ASTArray(in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
    ASTFactory::create(in_stack_fffffffffffffdd8,(int)((ulong)in_stack_fffffffffffffdd0 >> 0x20));
    ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
    ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
    RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
    ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
    ASTFactory::make(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
    RefCount<AST>::operator=
              ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  }
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
  nodes = (ASTArray *)operator_new(0x20);
  ASTArray::ASTArray(in_stack_fffffffffffffda0,(int)((ulong)in_stack_fffffffffffffd98 >> 0x20));
  ASTFactory::create(in_stack_fffffffffffffdd8,(int)((ulong)nodes >> 0x20));
  this_00 = ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
  ASTArray::add((ASTArray *)in_stack_fffffffffffffd90,&in_stack_fffffffffffffd88->down);
  ASTFactory::make(in_stack_fffffffffffffdd8,nodes);
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::operator=
            ((RefCount<AST> *)in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->down);
  bVar1 = false;
  pAVar4 = RefCount::operator_cast_to_AST_((RefCount *)local_20);
  this_01 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
  if (pAVar4 != this_01) {
    in_stack_fffffffffffffd98 = RefCount<AST>::operator->(local_20);
    AST::getFirstChild(in_stack_fffffffffffffd78);
    bVar1 = true;
    in_stack_fffffffffffffd90 = RefCount::operator_cast_to_AST_(local_158);
    in_stack_fffffffffffffd88 = RefCount::operator_cast_to_AST_((RefCount *)&nullAST);
    if (in_stack_fffffffffffffd90 != in_stack_fffffffffffffd88) {
      in_stack_fffffffffffffd80 = RefCount<AST>::operator->(local_20);
      AST::getFirstChild(in_stack_fffffffffffffd78);
      goto LAB_0020adce;
    }
  }
  RefCount<AST>::RefCount(&in_stack_fffffffffffffd90->down,&in_stack_fffffffffffffd88->down);
LAB_0020adce:
  RefCount<AST>::operator=(&this_01->down,&in_stack_fffffffffffffd98->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  if (bVar1) {
    RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  }
  ASTPair::advanceChildToEnd((ASTPair *)this_00);
  RefCount<AST>::operator=(&this_01->down,&in_stack_fffffffffffffd98->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  RefCount<Token>::~RefCount((RefCount<Token> *)in_stack_fffffffffffffd90);
  RefCount<AST>::~RefCount(&in_stack_fffffffffffffd80->down);
  ASTPair::~ASTPair((ASTPair *)in_stack_fffffffffffffd80);
  return;
}

Assistant:

void GrpParser::glyphAttrs() {
	
	returnAST = nullAST;
	ASTPair currentAST;
	RefAST glyphAttrs_AST = nullAST;
	RefToken  I = nullToken;
	RefAST I_AST = nullAST;
	RefAST A_AST = nullAST;
	RefAST X1_AST = nullAST;
	RefAST X2_AST = nullAST;
	RefAST X3_AST = nullAST;
	
	try {      // for error handling
		I = LT(1);
		I_AST = astFactory.create(I);
		match(IDENT);
		{
		switch ( LA(1)) {
		case OP_LBRACE:
		{
			RefAST tmp98_AST = nullAST;
			tmp98_AST = astFactory.create(LT(1));
			match(OP_LBRACE);
			{
			switch ( LA(1)) {
			case IDENT:
			case LIT_INT:
			case LITERAL_glyph:
			case LITERAL_justify:
			case LITERAL_min:
			case LITERAL_max:
			{
				attrItemList();
				X1_AST = returnAST;
				break;
			}
			case OP_RBRACE:
			{
				break;
			}
			default:
			{
				throw NoViableAltException(LT(1));
			}
			}
			}
			RefAST tmp99_AST = nullAST;
			tmp99_AST = astFactory.create(LT(1));
			match(OP_RBRACE);
			A_AST = astFactory.make( (new ASTArray(2))->add(astFactory.create(Zattrs))->add(X1_AST));
			break;
		}
		case OP_DOT:
		{
			RefAST tmp100_AST = nullAST;
			tmp100_AST = astFactory.create(LT(1));
			match(OP_DOT);
			{
			if ((_tokenSet_25.member(LA(1))) && (_tokenSet_26.member(LA(2)))) {
				attrItemFlat();
				X2_AST = returnAST;
			}
			else if ((_tokenSet_25.member(LA(1))) && (LA(2)==OP_LBRACE)) {
				attrItemStruct();
				X3_AST = returnAST;
			}
			else {
				throw NoViableAltException(LT(1));
			}
			
			}
			A_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(Zattrs))->add(X2_AST)->add(X3_AST));
			break;
		}
		default:
		{
			throw NoViableAltException(LT(1));
		}
		}
		}
		glyphAttrs_AST = currentAST.root;
		glyphAttrs_AST = astFactory.make( (new ASTArray(3))->add(astFactory.create(OP_PLUSEQUAL))->add(I_AST)->add(A_AST));
		currentAST.root = glyphAttrs_AST;
		currentAST.child = glyphAttrs_AST!=nullAST &&glyphAttrs_AST->getFirstChild()!=nullAST ?
			glyphAttrs_AST->getFirstChild() : glyphAttrs_AST;
		currentAST.advanceChildToEnd();
	}
	catch (ParserException& ex) {
		reportError(ex);
		consume();
		consumeUntil(_tokenSet_24);
	}
	returnAST = glyphAttrs_AST;
}